

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m4vd_vdpu1.c
# Opt level: O0

void vdpu1_mpg4d_setup_regs_by_syntax(hal_mpg4_ctx *ctx,MppSyntax syntax)

{
  RK_U8 RVar1;
  uint uVar2;
  void *pvVar3;
  uint *puVar4;
  int iVar5;
  uint uVar6;
  void *__dest;
  int local_c8;
  int local_c0;
  int local_b8;
  RK_U8 *local_a8;
  RK_U8 *local_a0;
  RK_U32 trb_per_trd_dm1;
  RK_U32 trb_per_trd_d1;
  RK_U32 trb_per_trd_d0;
  RK_U32 time_pp;
  RK_U32 time_bp;
  RK_U32 left_bytes;
  RK_U32 start_bit_offset;
  RK_U32 consumed_bytes_align;
  RK_U32 consumed_bytes;
  RK_U32 val;
  RK_U8 *src;
  RK_U8 *dst;
  DXVA2_DecodeBufferDesc *desc;
  RK_U32 i;
  RK_U32 stream_used;
  RK_U32 stream_length;
  RK_S32 mv_buf_fd;
  DXVA_QmatrixData *qm;
  DXVA_PicParams_MPEG4_PART2 *pp;
  DXVA2_DecodeBufferDesc **data;
  M4vdVdpu1Regs_t *regs;
  hal_mpg4_ctx *ctx_local;
  MppSyntax syntax_local;
  
  pvVar3 = ctx->regs;
  qm = (DXVA_QmatrixData *)0x0;
  _stream_length = (char *)0x0;
  iVar5 = mpp_buffer_get_fd_with_caller(ctx->mv_buf,"vdpu1_mpg4d_setup_regs_by_syntax");
  i = 0;
  desc._4_4_ = 0;
  for (desc._0_4_ = 0; (uint)desc < syntax.number; desc._0_4_ = (uint)desc + 1) {
    puVar4 = *(uint **)((long)syntax.data + (ulong)(uint)desc * 8);
    uVar6 = *puVar4;
    if (uVar6 == 0) {
      qm = *(DXVA_QmatrixData **)(puVar4 + 10);
    }
    else if (uVar6 == 4) {
      _stream_length = *(char **)(puVar4 + 10);
    }
    else if (uVar6 == 6) {
      i = puVar4[3];
      desc._4_4_ = puVar4[2];
      ctx->bitstrm_len = i;
    }
    else {
      _mpp_log_l(2,"hal_m4vd_vdpu1","found invalid buffer descriptor type %d\n",
                 "vdpu1_mpg4d_setup_regs_by_syntax",(ulong)*puVar4);
    }
  }
  if ((qm == (DXVA_QmatrixData *)0x0) &&
     (_mpp_log_l(2,"hal_m4vd_vdpu1","Assertion %s failed at %s:%d\n",(char *)0x0,"pp",
                 "vdpu1_mpg4d_setup_regs_by_syntax",0x42), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((_stream_length == (char *)0x0) &&
     (_mpp_log_l(2,"hal_m4vd_vdpu1","Assertion %s failed at %s:%d\n",(char *)0x0,"qm",
                 "vdpu1_mpg4d_setup_regs_by_syntax",0x43), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((i == 0) &&
     (_mpp_log_l(2,"hal_m4vd_vdpu1","Assertion %s failed at %s:%d\n",(char *)0x0,"stream_length",
                 "vdpu1_mpg4d_setup_regs_by_syntax",0x44), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((desc._4_4_ == 0) &&
     (_mpp_log_l(2,"hal_m4vd_vdpu1","Assertion %s failed at %s:%d\n",(char *)0x0,"stream_used",
                 "vdpu1_mpg4d_setup_regs_by_syntax",0x45), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  __dest = mpp_buffer_get_ptr_with_caller(ctx->qp_table,"vdpu1_mpg4d_setup_regs_by_syntax");
  if (*_stream_length == '\0') {
    local_a0 = default_intra_matrix;
  }
  else {
    local_a0 = (RK_U8 *)(_stream_length + 4);
  }
  memcpy(__dest,local_a0,0x40);
  if (_stream_length[1] == '\0') {
    local_a8 = default_inter_matrix;
  }
  else {
    local_a8 = (RK_U8 *)(_stream_length + 0x44);
  }
  memcpy((void *)((long)__dest + 0x40),local_a8,0x40);
  *(uint *)((long)pvVar3 + 0x10) =
       *(uint *)((long)pvVar3 + 0x10) & 0x7fffff |
       ((int)(*(ushort *)(qm->Qmatrix[0] + 0x20) + 0xf) >> 4) << 0x17;
  *(uint *)((long)pvVar3 + 0x10) =
       *(uint *)((long)pvVar3 + 0x10) & 0xfff807ff |
       ((int)(*(ushort *)(qm->Qmatrix[0] + 0x22) + 0xf) >> 4 & 0xffU) << 0xb;
  if (*(int *)qm->Qmatrix[1] == 4) {
    *(uint *)((long)pvVar3 + 0x10) =
         *(uint *)((long)pvVar3 + 0x10) & 0xff87ffff |
         (*(ushort *)(qm->Qmatrix[0] + 0x20) & 0xf) << 0x13;
    *(uint *)((long)pvVar3 + 0x10) =
         *(uint *)((long)pvVar3 + 0x10) & 0xfffff87f |
         (*(ushort *)(qm->Qmatrix[0] + 0x22) & 0xf) << 7;
  }
  else {
    *(uint *)((long)pvVar3 + 0x10) = *(uint *)((long)pvVar3 + 0x10) & 0xff87ffff;
    *(uint *)((long)pvVar3 + 0x10) = *(uint *)((long)pvVar3 + 0x10) & 0xfffff87f;
  }
  *(uint *)((long)pvVar3 + 0xc) = *(uint *)((long)pvVar3 + 0xc) & 0xfffffff | 0x10000000;
  *(uint *)((long)pvVar3 + 0x48) =
       *(uint *)((long)pvVar3 + 0x48) & 0xfff7ffff |
       (uint)(*(ushort *)(qm->Qmatrix[0] + 0x1c) >> 0xf) << 0x13;
  *(uint *)((long)pvVar3 + 0xc0) = *(uint *)((long)pvVar3 + 0xc0) & 0x7fffff;
  *(uint *)((long)pvVar3 + 0xc0) = *(uint *)((long)pvVar3 + 0xc0) & 0xff807fff;
  *(uint *)((long)pvVar3 + 0xc) = *(uint *)((long)pvVar3 + 0xc) & 0xffffbfff | 0x4000;
  *(uint *)((long)pvVar3 + 0x48) =
       *(uint *)((long)pvVar3 + 0x48) & 0xfffffffd |
       (uint)(*(ushort *)(qm->Qmatrix[0] + 0x1c) >> 10 & 1) << 1;
  *(uint *)((long)pvVar3 + 0x14) =
       *(uint *)((long)pvVar3 + 0x14) & 0xfff8ffff |
       (uint)(*(ushort *)(qm->Qmatrix[0] + 0x1c) >> 0xb & 7) << 0x10;
  *(uint *)((long)pvVar3 + 0x18) =
       *(uint *)((long)pvVar3 + 0x18) & 0x81ffffff | (qm->bNewQmatrix[2] & 0x3f) << 0x19;
  *(uint *)((long)pvVar3 + 0x14) = *(uint *)((long)pvVar3 + 0x14) & 0xfdffffff | 0x2000000;
  uVar6 = desc._4_4_ >> 3 & 0xfffffff8;
  *(undefined4 *)((long)pvVar3 + 0x30) = *(undefined4 *)((long)pvVar3 + 0x30);
  if (uVar6 != 0) {
    mpp_dev_set_reg_offset(ctx->dev,0xc,uVar6);
  }
  *(uint *)((long)pvVar3 + 0x14) = *(uint *)((long)pvVar3 + 0x14) & 0x3ffffff | desc._4_4_ << 0x1a;
  *(uint *)((long)pvVar3 + 0x18) =
       (uint)*(byte *)((long)pvVar3 + 0x1b) << 0x18 | i - uVar6 & 0xffffff;
  *(undefined2 *)((long)pvVar3 + 0x14) = *(undefined2 *)(qm->Qmatrix[0] + 8);
  RVar1 = qm->bNewQmatrix[1];
  if (RVar1 == '\0') {
    *(uint *)((long)pvVar3 + 0xc) = *(uint *)((long)pvVar3 + 0xc) & 0xffdfffff;
    *(uint *)((long)pvVar3 + 0xc) = *(uint *)((long)pvVar3 + 0xc) & 0xffefffff;
    *(RK_S32 *)((long)pvVar3 + 0x38) = ctx->fd_curr;
    *(RK_S32 *)((long)pvVar3 + 0x3c) = ctx->fd_curr;
    *(RK_S32 *)((long)pvVar3 + 0x40) = ctx->fd_curr;
    *(RK_S32 *)((long)pvVar3 + 0x44) = ctx->fd_curr;
    *(uint *)((long)pvVar3 + 0xc) = *(uint *)((long)pvVar3 + 0xc) & 0xffffefff;
    *(int *)((long)pvVar3 + 0xa4) = iVar5;
    *(uint *)((long)pvVar3 + 0x48) = *(uint *)((long)pvVar3 + 0x48) & 0xfff87fff | 0x8000;
    *(uint *)((long)pvVar3 + 0x48) = *(uint *)((long)pvVar3 + 0x48) & 0xffff87ff | 0x800;
  }
  else if (RVar1 == '\x01') {
    *(uint *)((long)pvVar3 + 0xc) = *(uint *)((long)pvVar3 + 0xc) & 0xffdfffff;
    *(uint *)((long)pvVar3 + 0xc) = *(uint *)((long)pvVar3 + 0xc) & 0xffefffff | 0x100000;
    if (ctx->fd_ref0 < 0) {
      *(RK_S32 *)((long)pvVar3 + 0x38) = ctx->fd_curr;
      *(RK_S32 *)((long)pvVar3 + 0x3c) = ctx->fd_curr;
    }
    else {
      *(RK_S32 *)((long)pvVar3 + 0x38) = ctx->fd_ref0;
      *(RK_S32 *)((long)pvVar3 + 0x3c) = ctx->fd_ref0;
    }
    *(RK_S32 *)((long)pvVar3 + 0x40) = ctx->fd_curr;
    *(RK_S32 *)((long)pvVar3 + 0x44) = ctx->fd_curr;
    *(uint *)((long)pvVar3 + 0x48) =
         *(uint *)((long)pvVar3 + 0x48) & 0xfff87fff | (uint)(qm->Qmatrix[0][0x36] & 7) << 0xf;
    *(uint *)((long)pvVar3 + 0x48) =
         *(uint *)((long)pvVar3 + 0x48) & 0xffff87ff | (uint)(qm->Qmatrix[0][0x36] & 7) << 0xb;
    *(uint *)((long)pvVar3 + 0xc) = *(uint *)((long)pvVar3 + 0xc) & 0xffffefff | 0x1000;
    *(int *)((long)pvVar3 + 0xa4) = iVar5;
  }
  else if (RVar1 == '\x02') {
    uVar6 = *(uint *)(qm->Qmatrix[1] + 8);
    uVar2 = *(uint *)(qm->Qmatrix[1] + 0xc);
    if (uVar2 == 0) {
      local_b8 = uVar6 * 0x8000000 + -1;
    }
    else {
      local_b8 = (int)(((ulong)uVar6 * 0x8000000 + (ulong)(uVar2 - 1)) / (ulong)uVar2);
    }
    if (uVar2 * 2 == -1) {
      local_c0 = (uVar6 * 2 + 1) * 0x8000000 + uVar2 * 2;
    }
    else {
      local_c0 = (int)(((ulong)(uVar6 * 2 + 1) * 0x8000000 + (ulong)(uVar2 << 1)) /
                      (ulong)(uVar2 * 2 + 1));
    }
    if (uVar2 * 2 == 1) {
      local_c8 = (uVar6 * 2 + -1) * 0x8000000 + (uVar2 - 1) * 2;
    }
    else {
      local_c8 = (int)(((ulong)(uVar6 * 2 - 1) * 0x8000000 + (ulong)((uVar2 - 1) * 2)) /
                      (ulong)(uVar2 * 2 - 1));
    }
    *(uint *)((long)pvVar3 + 0xc) = *(uint *)((long)pvVar3 + 0xc) & 0xffdfffff | 0x200000;
    *(uint *)((long)pvVar3 + 0xc) = *(uint *)((long)pvVar3 + 0xc) & 0xffefffff | 0x100000;
    *(uint *)((long)pvVar3 + 0x48) = *(uint *)((long)pvVar3 + 0x48) & 0xfffffffd;
    *(undefined4 *)((long)pvVar3 + 0x38) = 1;
    if ((ctx->fd_ref1 < 0) &&
       (_mpp_log_l(2,"hal_m4vd_vdpu1","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "ctx->fd_ref1 >= 0","vdpu1_mpg4d_setup_regs_by_syntax",0x91),
       (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if (ctx->fd_ref1 < 0) {
      *(RK_S32 *)((long)pvVar3 + 0x38) = ctx->fd_curr;
      *(RK_S32 *)((long)pvVar3 + 0x3c) = ctx->fd_curr;
    }
    else {
      *(RK_S32 *)((long)pvVar3 + 0x38) = ctx->fd_ref1;
      *(RK_S32 *)((long)pvVar3 + 0x3c) = ctx->fd_ref1;
    }
    if ((ctx->fd_ref0 < 0) &&
       (_mpp_log_l(2,"hal_m4vd_vdpu1","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "ctx->fd_ref0 >= 0","vdpu1_mpg4d_setup_regs_by_syntax",0x9a),
       (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if (ctx->fd_ref0 < 0) {
      *(RK_S32 *)((long)pvVar3 + 0x40) = ctx->fd_curr;
      *(RK_S32 *)((long)pvVar3 + 0x44) = ctx->fd_curr;
    }
    else {
      *(RK_S32 *)((long)pvVar3 + 0x40) = ctx->fd_ref0;
      *(RK_S32 *)((long)pvVar3 + 0x44) = ctx->fd_ref0;
    }
    *(uint *)((long)pvVar3 + 0x48) =
         *(uint *)((long)pvVar3 + 0x48) & 0xfff87fff | (uint)(qm->Qmatrix[0][0x36] & 7) << 0xf;
    *(uint *)((long)pvVar3 + 0x48) =
         *(uint *)((long)pvVar3 + 0x48) & 0xffff87ff | (uint)(qm->Qmatrix[0][0x36] & 7) << 0xb;
    *(uint *)((long)pvVar3 + 0x48) =
         *(uint *)((long)pvVar3 + 0x48) & 0xfffff87f | (uint)(qm->Qmatrix[0][0x36] >> 3 & 7) << 7;
    *(uint *)((long)pvVar3 + 0x48) =
         *(uint *)((long)pvVar3 + 0x48) & 0xffffff87 | (uint)(qm->Qmatrix[0][0x36] >> 3 & 7) << 3;
    *(uint *)((long)pvVar3 + 0xc) = *(uint *)((long)pvVar3 + 0xc) & 0xffffefff;
    *(int *)((long)pvVar3 + 0xa4) = iVar5;
    *(int *)((long)pvVar3 + 0x4c) = local_b8;
    *(int *)((long)pvVar3 + 0x54) = local_c0;
    *(int *)((long)pvVar3 + 0x50) = local_c8;
  }
  if ((*(ushort *)(qm->Qmatrix[0] + 0x1c) >> 2 & 1) != 0) {
    *(uint *)((long)pvVar3 + 0xc) = *(uint *)((long)pvVar3 + 0xc) & 0xff7fffff | 0x800000;
    *(uint *)((long)pvVar3 + 0xc) = *(uint *)((long)pvVar3 + 0xc) & 0xffbfffff;
    *(uint *)((long)pvVar3 + 0x10) =
         *(uint *)((long)pvVar3 + 0x10) & 0xffffffdf |
         (uint)(*(ushort *)(qm->Qmatrix[0] + 0x1c) >> 0xe & 1) << 5;
  }
  *(uint *)((long)pvVar3 + 0x48) =
       *(uint *)((long)pvVar3 + 0x48) & 0xfffffffe | *(uint *)(qm->Qmatrix[1] + 4) & 1;
  *(uint *)((long)pvVar3 + 0x14) =
       *(uint *)((long)pvVar3 + 0x14) & 0xfeffffff |
       (uint)(*(ushort *)(qm->Qmatrix[0] + 0x1c) >> 3 & 1) << 0x18;
  iVar5 = mpp_buffer_get_fd_with_caller(ctx->qp_table,"vdpu1_mpg4d_setup_regs_by_syntax");
  *(int *)((long)pvVar3 + 0xa0) = iVar5;
  *(uint *)((long)pvVar3 + 0x48) =
       *(uint *)((long)pvVar3 + 0x48) & 0xfffffffb |
       (uint)(*(ushort *)(qm->Qmatrix[0] + 0x1c) >> 4 & 1) << 2;
  return;
}

Assistant:

static void vdpu1_mpg4d_setup_regs_by_syntax(hal_mpg4_ctx *ctx, MppSyntax syntax)
{
    M4vdVdpu1Regs_t *regs = ctx->regs;
    DXVA2_DecodeBufferDesc **data = syntax.data;
    DXVA_PicParams_MPEG4_PART2 *pp = NULL;
    DXVA_QmatrixData *qm = NULL;
    RK_S32 mv_buf_fd = mpp_buffer_get_fd(ctx->mv_buf);
    RK_U32 stream_length = 0;
    RK_U32 stream_used = 0;
    RK_U32 i;

    for (i = 0; i < syntax.number; i++) {
        DXVA2_DecodeBufferDesc *desc = data[i];
        switch (desc->CompressedBufferType) {
        case DXVA2_PictureParametersBufferType : {
            pp = (DXVA_PicParams_MPEG4_PART2 *)desc->pvPVPState;
        } break;
        case DXVA2_InverseQuantizationMatrixBufferType : {
            qm = (DXVA_QmatrixData *)desc->pvPVPState;
        } break;
        case DXVA2_BitStreamDateBufferType : {
            stream_length = desc->DataSize;
            stream_used = desc->DataOffset;
            ctx->bitstrm_len = stream_length;
        } break;
        default : {
            mpp_err_f("found invalid buffer descriptor type %d\n", desc->CompressedBufferType);
        } break;
        }
    }

    mpp_assert(pp);
    mpp_assert(qm);
    mpp_assert(stream_length);
    mpp_assert(stream_used);

    // copy qp table to buffer
    {
        RK_U8 *dst = (RK_U8 *)mpp_buffer_get_ptr(ctx->qp_table);
        RK_U8 *src = (qm->bNewQmatrix[0]) ? (qm->Qmatrix[0]) : (default_intra_matrix);

        memcpy(dst, src, 64);
        dst += 64;

        src = (qm->bNewQmatrix[1]) ? (qm->Qmatrix[1]) : (default_inter_matrix);
        memcpy(dst, src, 64);
    }

    regs->SwReg04.sw_pic_mb_width = (pp->vop_width  + 15) >> 4;
    regs->SwReg04.sw_pic_mb_hight_p = (pp->vop_height + 15) >> 4;

    if (pp->custorm_version == 4) {
        regs->SwReg04.sw_mb_width_off = pp->vop_width & 0xf;
        regs->SwReg04.sw_mb_height_off = pp->vop_height & 0xf;
    } else {
        regs->SwReg04.sw_mb_width_off = 0;
        regs->SwReg04.sw_mb_height_off = 0;
    }

    regs->SwReg03.sw_dec_mode = 1;

    /* note: When comparing bit 19 of reg136(that is sw_alt_scan_flag_e) with bit 6 of
    **       reg120(that is sw_alt_scan_e), we may be confused about the function of
    **       these two bits. According to C Model, just sw_alt_scan_flag_e is set,
    **       but not sw_alt_scan_e.
    */
    regs->SwReg18.sw_alt_scan_flag_e = pp->alternate_vertical_scan_flag;
    regs->SwReg48.sw_startmb_x = 0;
    regs->SwReg48.sw_startmb_y = 0;
    regs->SwReg03.sw_filtering_dis = 1;
    regs->SwReg18.sw_mpeg4_vc1_rc = pp->vop_rounding_type;
    regs->SwReg05.sw_intradc_vlc_thr = pp->intra_dc_vlc_thr;
    regs->SwReg06.sw_init_qp = pp->vop_quant;
    regs->SwReg05.sw_sync_markers_e = 1;

    {
        /*
         * update stream base address here according to consumed bit length
         * 1. hardware start address has to be 64 bit align
         * 2. hardware need to know which is the start bit in
         * 2. pass (10bit fd + (offset << 10)) register value to kernel
         */
        RK_U32 val = regs->SwReg12.sw_rlc_vlc_base;
        RK_U32 consumed_bytes = stream_used >> 3;
        RK_U32 consumed_bytes_align = consumed_bytes & (~0x7);
        RK_U32 start_bit_offset = stream_used & 0x3F;
        RK_U32 left_bytes = stream_length - consumed_bytes_align;

        regs->SwReg12.sw_rlc_vlc_base = val;
        if (consumed_bytes_align)
            mpp_dev_set_reg_offset(ctx->dev, 12, consumed_bytes_align);
        regs->SwReg05.sw_strm_start_bit = start_bit_offset;
        regs->SwReg06.sw_stream_len = left_bytes;
    }
    regs->SwReg05.sw_vop_time_incr = pp->vop_time_increment_resolution;

    switch (pp->vop_coding_type) {
    case MPEG4_B_VOP : {
        RK_U32 time_bp = pp->time_bp;
        RK_U32 time_pp = pp->time_pp;

        RK_U32 trb_per_trd_d0  = MPP_DIV((((RK_S64)(1 * time_bp + 0)) << 27) + 1 * (time_pp - 1), time_pp);
        RK_U32 trb_per_trd_d1  = MPP_DIV((((RK_S64)(2 * time_bp + 1)) << 27) + 2 * (time_pp - 0), 2 * time_pp + 1);
        RK_U32 trb_per_trd_dm1 = MPP_DIV((((RK_S64)(2 * time_bp - 1)) << 27) + 2 * (time_pp - 1), 2 * time_pp - 1);

        regs->SwReg03.sw_pic_b_e = 1;
        regs->SwReg03.sw_pic_inter_e = 1;
        regs->SwReg18.sw_mpeg4_vc1_rc = 0;
        regs->SwReg14.sw_refer0_base = 1;

        mpp_assert(ctx->fd_ref1 >= 0);
        if (ctx->fd_ref1 >= 0) {
            regs->SwReg14.sw_refer0_base = (RK_U32)ctx->fd_ref1;
            regs->SwReg15.sw_refer1_base = (RK_U32)ctx->fd_ref1;
        } else {
            regs->SwReg14.sw_refer0_base = (RK_U32)ctx->fd_curr;
            regs->SwReg15.sw_refer1_base = (RK_U32)ctx->fd_curr;
        }

        mpp_assert(ctx->fd_ref0 >= 0);
        if (ctx->fd_ref0 >= 0) {
            regs->SwReg16.sw_refer2_base = (RK_U32)ctx->fd_ref0;
            regs->SwReg17.sw_refer3_base = (RK_U32)ctx->fd_ref0;
        } else {
            regs->SwReg16.sw_refer2_base = (RK_U32)ctx->fd_curr;
            regs->SwReg17.sw_refer3_base = (RK_U32)ctx->fd_curr;
        }

        regs->SwReg18.sw_fcode_fwd_hor = pp->vop_fcode_forward;
        regs->SwReg18.sw_fcode_fwd_ver = pp->vop_fcode_forward;
        regs->SwReg18.sw_fcode_bwd_hor = pp->vop_fcode_backward;
        regs->SwReg18.sw_fcode_bwd_ver = pp->vop_fcode_backward;
        regs->SwReg03.sw_write_mvs_e = 0;
        regs->SwReg41.sw_dir_mv_base = mv_buf_fd;
        regs->SwReg19.sw_refer5_base = trb_per_trd_d0;
        regs->SwReg21.sw_refer7_base = trb_per_trd_d1;
        regs->SwReg20.sw_refer6_base = trb_per_trd_dm1;
    } break;
    case MPEG4_P_VOP : {
        regs->SwReg03.sw_pic_b_e = 0;
        regs->SwReg03.sw_pic_inter_e = 1;

        if (ctx->fd_ref0 >= 0) {
            regs->SwReg14.sw_refer0_base = (RK_U32)ctx->fd_ref0;
            regs->SwReg15.sw_refer1_base = (RK_U32)ctx->fd_ref0;
        } else {
            regs->SwReg14.sw_refer0_base = (RK_U32)ctx->fd_curr;
            regs->SwReg15.sw_refer1_base = (RK_U32)ctx->fd_curr;
        }
        regs->SwReg16.sw_refer2_base = (RK_U32)ctx->fd_curr;
        regs->SwReg17.sw_refer3_base = (RK_U32)ctx->fd_curr;

        regs->SwReg18.sw_fcode_fwd_hor = pp->vop_fcode_forward;
        regs->SwReg18.sw_fcode_fwd_ver = pp->vop_fcode_forward;
        regs->SwReg03.sw_write_mvs_e = 1;
        regs->SwReg41.sw_dir_mv_base = mv_buf_fd;
    } break;
    case MPEG4_I_VOP : {
        regs->SwReg03.sw_pic_b_e = 0;
        regs->SwReg03.sw_pic_inter_e = 0;

        regs->SwReg14.sw_refer0_base = (RK_U32)ctx->fd_curr;
        regs->SwReg15.sw_refer1_base = (RK_U32)ctx->fd_curr;
        regs->SwReg16.sw_refer2_base = (RK_U32)ctx->fd_curr;
        regs->SwReg17.sw_refer3_base = (RK_U32)ctx->fd_curr;

        regs->SwReg03.sw_write_mvs_e = 0;
        regs->SwReg41.sw_dir_mv_base = mv_buf_fd;

        regs->SwReg18.sw_fcode_fwd_hor = 1;
        regs->SwReg18.sw_fcode_fwd_ver = 1;
    } break;
    default : {
        /* no nothing */
    } break;
    }

    if (pp->interlaced) {
        regs->SwReg03.sw_pic_interlace_e = 1;
        regs->SwReg03.sw_pic_fieldmode_e = 0;
        regs->SwReg04.sw_topfieldfirst_e = pp->top_field_first;
    }

    regs->SwReg18.sw_prev_anc_type = pp->prev_coding_type;
    regs->SwReg05.sw_type1_quant_e = pp->quant_type;
    regs->SwReg40.sw_qtable_base = mpp_buffer_get_fd(ctx->qp_table);
    regs->SwReg18.sw_mv_accuracy_fwd = pp->quarter_sample;

}